

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall
pbrt::QuadMesh::getPrimBounds
          (box3f *__return_storage_ptr__,QuadMesh *this,size_t primID,affine3f *xfm)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  pointer pvVar20;
  pointer pvVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  pvVar20 = (this->vertex).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar21 = (this->index).super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
            _M_impl.super__Vector_impl_data._M_start;
  fVar31 = pvVar20[pvVar21[primID].x].x;
  fVar1 = (xfm->l).vx.z;
  fVar22 = (xfm->l).vy.z;
  uVar4 = pvVar20[pvVar21[primID].x].y;
  uVar12 = pvVar20[pvVar21[primID].x].z;
  fVar2 = (xfm->l).vz.z;
  fVar23 = (xfm->p).z;
  fVar26 = (float)uVar12 * fVar2 + fVar31 * fVar1 + (float)uVar4 * fVar22 + fVar23;
  fVar27 = fVar26;
  if (3.4028235e+38 <= fVar26) {
    fVar27 = 3.4028235e+38;
  }
  if (fVar26 <= -3.4028235e+38) {
    fVar26 = -3.4028235e+38;
  }
  fVar3 = pvVar20[pvVar21[primID].y].x;
  uVar5 = pvVar20[pvVar21[primID].y].y;
  uVar13 = pvVar20[pvVar21[primID].y].z;
  fVar28 = fVar2 * (float)uVar13 + fVar1 * fVar3 + fVar22 * (float)uVar5 + fVar23;
  fVar35 = fVar28;
  if (fVar27 <= fVar28) {
    fVar35 = fVar27;
  }
  if (fVar28 <= fVar26) {
    fVar28 = fVar26;
  }
  fVar27 = pvVar20[pvVar21[primID].z].x;
  uVar6 = pvVar20[pvVar21[primID].z].y;
  uVar14 = pvVar20[pvVar21[primID].z].z;
  fVar26 = fVar2 * (float)uVar14 + fVar1 * fVar27 + fVar22 * (float)uVar6 + fVar23;
  fVar29 = fVar26;
  if (fVar35 <= fVar26) {
    fVar29 = fVar35;
  }
  if (fVar26 <= fVar28) {
    fVar26 = fVar28;
  }
  fVar35 = pvVar20[pvVar21[primID].w].x;
  uVar7 = pvVar20[pvVar21[primID].w].y;
  uVar15 = pvVar20[pvVar21[primID].w].z;
  fVar23 = fVar2 * (float)uVar15 + fVar1 * fVar35 + fVar22 * (float)uVar7 + fVar23;
  uVar8 = (xfm->l).vx.x;
  uVar16 = (xfm->l).vx.y;
  uVar9 = (xfm->l).vy.x;
  uVar17 = (xfm->l).vy.y;
  uVar10 = (xfm->l).vz.x;
  uVar18 = (xfm->l).vz.y;
  uVar11 = (xfm->p).x;
  uVar19 = (xfm->p).y;
  auVar24._0_8_ =
       CONCAT44((float)uVar12 * (float)uVar18 +
                (float)uVar4 * (float)uVar17 + fVar31 * (float)uVar16 + (float)uVar19,
                (float)uVar12 * (float)uVar10 + (float)uVar4 * (float)uVar9 + fVar31 * (float)uVar8
                + (float)uVar11);
  auVar24._8_4_ = (float)uVar12 * 0.0 + (float)uVar4 * 0.0 + fVar31 * 0.0 + 0.0;
  auVar24._12_4_ = (float)uVar12 * 0.0 + (float)uVar4 * 0.0 + fVar31 * 0.0 + 0.0;
  auVar36._8_4_ = auVar24._8_4_;
  auVar36._0_8_ = auVar24._0_8_;
  auVar36._12_4_ = auVar24._12_4_;
  auVar37 = minps(auVar36,_DAT_0015fb80);
  auVar25._0_8_ =
       CONCAT44((float)uVar13 * (float)uVar18 + (float)uVar5 * (float)uVar17 + fVar3 * (float)uVar16
                + (float)uVar19,
                (float)uVar13 * (float)uVar10 + (float)uVar5 * (float)uVar9 + fVar3 * (float)uVar8 +
                (float)uVar11);
  auVar25._8_4_ = (float)uVar13 * 0.0 + (float)uVar5 * 0.0 + fVar3 * 0.0 + 0.0;
  auVar25._12_4_ = (float)uVar13 * 0.0 + (float)uVar5 * 0.0 + fVar3 * 0.0 + 0.0;
  auVar34._8_4_ = auVar25._8_4_;
  auVar34._0_8_ = auVar25._0_8_;
  auVar34._12_4_ = auVar25._12_4_;
  auVar32 = minps(auVar34,auVar37);
  auVar37._0_8_ =
       CONCAT44((float)uVar14 * (float)uVar18 +
                (float)uVar6 * (float)uVar17 + fVar27 * (float)uVar16 + (float)uVar19,
                (float)uVar14 * (float)uVar10 + (float)uVar6 * (float)uVar9 + fVar27 * (float)uVar8
                + (float)uVar11);
  auVar37._8_4_ = (float)uVar14 * 0.0 + (float)uVar6 * 0.0 + fVar27 * 0.0 + 0.0;
  auVar37._12_4_ = (float)uVar14 * 0.0 + (float)uVar6 * 0.0 + fVar27 * 0.0 + 0.0;
  auVar33._8_4_ = auVar37._8_4_;
  auVar33._0_8_ = auVar37._0_8_;
  auVar33._12_4_ = auVar37._12_4_;
  auVar34 = minps(auVar33,auVar32);
  auVar32._0_8_ =
       CONCAT44((float)uVar15 * (float)uVar18 +
                (float)uVar7 * (float)uVar17 + fVar35 * (float)uVar16 + (float)uVar19,
                (float)uVar15 * (float)uVar10 + (float)uVar7 * (float)uVar9 + fVar35 * (float)uVar8
                + (float)uVar11);
  auVar32._8_4_ = (float)uVar15 * 0.0 + (float)uVar7 * 0.0 + fVar35 * 0.0 + 0.0;
  auVar32._12_4_ = (float)uVar15 * 0.0 + (float)uVar7 * 0.0 + fVar35 * 0.0 + 0.0;
  auVar30._8_4_ = auVar32._8_4_;
  auVar30._0_8_ = auVar32._0_8_;
  auVar30._12_4_ = auVar32._12_4_;
  auVar30 = minps(auVar30,auVar34);
  fVar31 = fVar23;
  if (fVar29 <= fVar23) {
    fVar31 = fVar29;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar30._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar30._0_8_ >> 0x20);
  auVar24 = maxps(auVar24,_DAT_0015e2c0);
  (__return_storage_ptr__->lower).z = fVar31;
  auVar24 = maxps(auVar25,auVar24);
  auVar24 = maxps(auVar37,auVar24);
  auVar24 = maxps(auVar32,auVar24);
  if (fVar23 <= fVar26) {
    fVar23 = fVar26;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar24._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar23;
  return __return_storage_ptr__;
}

Assistant:

box3f QuadMesh::getPrimBounds(const size_t primID, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].x]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].y]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].z]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].w]));
    return primBounds;
  }